

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# card.cpp
# Opt level: O3

ostream * operator<<(ostream *os,Card *card)

{
  _Alloc_hider _Var1;
  size_t sVar2;
  string local_58;
  string local_38;
  
  suitName_abi_cxx11_(&local_38,card->m_suit);
  _Var1._M_p = local_38._M_dataplus._M_p;
  if (local_38._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(local_38._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(os,_Var1._M_p,sVar2);
  }
  valueName_abi_cxx11_(&local_58,card->m_value);
  _Var1._M_p = local_58._M_dataplus._M_p;
  if (local_58._M_dataplus._M_p == (char *)0x0) {
    std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
  }
  else {
    sVar2 = strlen(local_58._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(os,_Var1._M_p,sVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Card &card) {
    os << suitName(card.m_suit).c_str() << valueName(card.m_value).c_str();
    return os;
}